

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.h
# Opt level: O2

int SetTask(void)

{
  int iVar1;
  time_t start;
  ostream *poVar2;
  string input;
  string word;
  
  start = time((time_t *)0x0);
  std::__cxx11::string::string((string *)&word,(string *)(currentArray_abi_cxx11_ + start % 100));
  input._M_dataplus._M_p = (pointer)&input.field_2;
  input._M_string_length = 0;
  input.field_2._M_local_buf[0] = '\0';
  poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_1cb6 + 0xf);
  poVar2 = std::operator<<(poVar2,(string *)&word);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::operator>>((istream *)&std::cin,(string *)&input);
  iVar1 = WriteCheck(&word,&input);
  if (iVar1 == 0) {
    TimerCheck(start);
    iVar1 = TimerCheck(start);
    if (0 < iVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_1cf8);
      std::endl<char,std::char_traits<char>>(poVar2);
      iVar1 = TimerCheck(start);
      Points = Points + iVar1;
      poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_1d0e);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,Points);
      std::endl<char,std::char_traits<char>>(poVar2);
      goto LAB_00103af1;
    }
    std::operator<<((ostream *)&std::cout,anon_var_dwarf_1d18);
  }
  iVar1 = WriteCheck(&word,&input);
  if (iVar1 != 0) {
    std::operator<<((ostream *)&std::cout,anon_var_dwarf_1d2e);
    poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_1d44);
    std::endl<char,std::char_traits<char>>(poVar2);
    Flag = 0;
  }
LAB_00103af1:
  std::__cxx11::string::~string((string *)&input);
  std::__cxx11::string::~string((string *)&word);
  return 0;
}

Assistant:

int SetTask()
{

    time_t start = time(NULL);
    // cout << start << endl;
    string word = currentArray[start % 100];
    string input;
    cout << "Пиши слово : " << word << endl;
    cin >> input;
    if (WriteCheck(word, input) == 0) {
        TimerCheck(start);
        if (TimerCheck(start) > 0) {
            cout << "Молодец" << endl;
            Points += TimerCheck(start);
            cout << "Очков=" << Points << endl;
            return 0;
        } else {
            cout << "Не влез во время";
        }
    }
    if (WriteCheck(word, input) == 1) {
        cout << "Не верно,ты опечатался\n";
        cout << "Ты проиграл" << endl;
        Flag = 0;
        return 0;
    } else
        ;

    return 0;
}